

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall chatra::RuntimeImp::removeBreakPoint(RuntimeImp *this)

{
  BreakPointId in_RSI;
  
  removeBreakPoint((RuntimeImp *)&this[-1].nextBreakPointId,in_RSI);
  return;
}

Assistant:

void RuntimeImp::removeBreakPoint(debugger::BreakPointId breakPointId) {
	CHATRA_CHECK_RUNTIME_PAUSED;

	auto it = breakPoints.find(breakPointId);
	if (it == breakPoints.cend())
		throw IllegalArgumentException();

	cancelBreakPoint(it->second);
	breakPoints.erase(it);
}